

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O2

void __thiscall WithEnv::WithEnv(WithEnv *this,string *var,string *val)

{
  std::__cxx11::string::string((string *)this,(string *)var);
  std::__cxx11::string::string((string *)&this->val,(string *)val);
  Reset(this);
  return;
}

Assistant:

WithEnv(const std::string& var, const std::string& val) : var{var}, val{val} {
    Reset();
  }